

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::native(SmallVectorImpl<char> *Path,Style style)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar6;
  char *__last;
  SmallString<128U> PathHome;
  char local_a1;
  SmallVectorImpl<char> local_a0;
  undefined1 local_90 [128];
  char *pcVar5;
  
  uVar6 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (uVar6 != 0) {
    pcVar4 = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    __last = pcVar4 + uVar6;
    if (style == windows) {
      local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX =
           (void *)CONCAT71(local_a0.super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                            ._1_7_,0x2f);
      local_a1 = '\\';
      std::replace<char*,char>(pcVar4,__last,(char *)&local_a0,&local_a1);
      uVar2 = (Path->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar2 == 0) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      pcVar4 = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      if ((*pcVar4 == '~') &&
         (((uVar2 == 1 || (cVar1 = pcVar4[1], cVar1 == '\\')) || (cVar1 == '/')))) {
        local_a0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_90;
        local_a0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
        local_a0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x80;
        home_directory(&local_a0);
        pvVar3 = (Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        SmallVectorImpl<char>::append<char*,void>
                  (&local_a0,(char *)((long)pvVar3 + 1),
                   (char *)((ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .Size + (long)pvVar3));
        SmallVectorImpl<char>::operator=(Path,&local_a0);
        SmallVectorImpl<char>::~SmallVectorImpl(&local_a0);
      }
    }
    else {
      while (pcVar4 < __last) {
        pcVar5 = pcVar4;
        if ((*pcVar4 == '\\') && ((pcVar5 = pcVar4 + 1, __last <= pcVar5 || (*pcVar5 != '\\')))) {
          *pcVar4 = '/';
          pcVar5 = pcVar4;
        }
        pcVar4 = pcVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void native(SmallVectorImpl<char> &Path, Style style) {
  if (Path.empty())
    return;
  if (real_style(style) == Style::windows) {
    std::replace(Path.begin(), Path.end(), '/', '\\');
    if (Path[0] == '~' && (Path.size() == 1 || is_separator(Path[1], style))) {
      SmallString<128> PathHome;
      home_directory(PathHome);
      PathHome.append(Path.begin() + 1, Path.end());
      Path = PathHome;
    }
  } else {
    for (auto PI = Path.begin(), PE = Path.end(); PI < PE; ++PI) {
      if (*PI == '\\') {
        auto PN = PI + 1;
        if (PN < PE && *PN == '\\')
          ++PI; // increment once, the for loop will move over the escaped slash
        else
          *PI = '/';
      }
    }
  }
}